

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O2

Am_Slot_Key Am_From_Slot_Name(char *string)

{
  Am_Slot_Key AVar1;
  int iVar2;
  
  verify_slot_name_key_table();
  iVar2 = Am_Symbol_Table::Get_Value(Am_Slot_Name_Key_Table,string);
  AVar1 = (Am_Slot_Key)iVar2;
  if (iVar2 == -1) {
    AVar1 = 0;
  }
  return AVar1;
}

Assistant:

Am_Slot_Key
Am_From_Slot_Name(const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key == -1)
    return 0;
  else
    return (Am_Slot_Key)prev_key;
}